

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_CCtx_refPrefix_advanced
                 (ZSTD_CCtx *cctx,void *prefix,size_t prefixSize,
                 ZSTD_dictContentType_e dictContentType)

{
  if (cctx->streamStage != zcss_init) {
    return 0xffffffffffffffc4;
  }
  ZSTD_customFree((cctx->localDict).dictBuffer,cctx->customMem);
  ZSTD_freeCDict((cctx->localDict).cdict);
  (cctx->localDict).dictBuffer = (void *)0x0;
  (cctx->localDict).dict = (void *)0x0;
  (cctx->localDict).dictSize = 0;
  *(undefined8 *)&(cctx->localDict).dictContentType = 0;
  (cctx->localDict).cdict = (ZSTD_CDict *)0x0;
  cctx->cdict = (ZSTD_CDict *)0x0;
  (cctx->prefixDict).dict = (void *)0x0;
  (cctx->prefixDict).dictSize = 0;
  *(undefined8 *)&(cctx->prefixDict).dictContentType = 0;
  if (prefixSize != 0 && prefix != (void *)0x0) {
    (cctx->prefixDict).dict = prefix;
    (cctx->prefixDict).dictSize = prefixSize;
    (cctx->prefixDict).dictContentType = dictContentType;
  }
  return 0;
}

Assistant:

size_t ZSTD_CCtx_refPrefix_advanced(
        ZSTD_CCtx* cctx, const void* prefix, size_t prefixSize, ZSTD_dictContentType_e dictContentType)
{
    RETURN_ERROR_IF(cctx->streamStage != zcss_init, stage_wrong,
                    "Can't ref a prefix when ctx not in init stage.");
    ZSTD_clearAllDicts(cctx);
    if (prefix != NULL && prefixSize > 0) {
        cctx->prefixDict.dict = prefix;
        cctx->prefixDict.dictSize = prefixSize;
        cctx->prefixDict.dictContentType = dictContentType;
    }
    return 0;
}